

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_vcodec_client.c
# Opt level: O0

RK_S32 mpp_vcodec_open(void)

{
  uint uVar1;
  uint *puVar2;
  int *piVar3;
  char *pcVar4;
  int local_c;
  RK_S32 fd;
  
  local_c = open64("/dev/vcodec",0x80002);
  if (local_c < 0) {
    puVar2 = (uint *)__errno_location();
    uVar1 = *puVar2;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    _mpp_log_l(2,"mpp_vcodec","open /dev/vcodec failed errno %d %s\n",(char *)0x0,(ulong)uVar1,
               pcVar4);
    local_c = -1;
  }
  return local_c;
}

Assistant:

RK_S32 mpp_vcodec_open(void)
{
    RK_S32 fd = -1;

    fd = open("/dev/vcodec", O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        mpp_err("open /dev/vcodec failed errno %d %s\n", errno, strerror(errno));
        return -1;
    }

    return fd;
}